

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.hpp
# Opt level: O3

bool __thiscall
openjij::graph::Sparse<double>::set_adj_node(Sparse<double> *this,Index from,Index to)

{
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  ulong uVar1;
  pointer pvVar2;
  iterator __position;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  unsigned_long local_28;
  
  uVar1 = (this->super_Graph)._num_spins;
  local_28 = to;
  if (uVar1 <= from) {
    __assert_fail("from < this->get_num_spins()",
                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                  ,0x52,
                  "bool openjij::graph::Sparse<double>::set_adj_node(Index, Index) [FloatType = double]"
                 );
  }
  if (to < uVar1) {
    pvVar2 = (this->_list_adj_nodes).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                      (pvVar2[from].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       *(pointer *)
                        ((long)&pvVar2[from].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data + 8),&local_28);
    __position._M_current =
         *(pointer *)
          ((long)&pvVar2[from].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data + 8);
    if (_Var3._M_current == __position._M_current) {
      this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)(pvVar2 + from);
      if (this->_num_edges <= (ulong)((long)_Var3._M_current - *(long *)this_00 >> 3)) {
        __assert_fail("nodes.size() < _num_edges",
                      "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                      ,0x5c,
                      "bool openjij::graph::Sparse<double>::set_adj_node(Index, Index) [FloatType = double]"
                     );
      }
      if (_Var3._M_current == *(unsigned_long **)(this_00 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(this_00,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
      }
      set_adj_node(this,local_28,from);
    }
    return true;
  }
  __assert_fail("to < this->get_num_spins()",
                "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                ,0x53,
                "bool openjij::graph::Sparse<double>::set_adj_node(Index, Index) [FloatType = double]"
               );
}

Assistant:

inline bool set_adj_node(Index from, Index to) {
    assert(from < this->get_num_spins());
    assert(to < this->get_num_spins());

    // get adjacent nodes of node "from"
    Nodes &nodes = _list_adj_nodes[from];
    // check if the node "to" exists in the nodes
    if (std::find(nodes.begin(), nodes.end(), to) == nodes.end()) {
      // nodes size must be smaller than num_edges

#ifndef NDEBUG
      assert(nodes.size() < _num_edges);
#else
      // return false
      if (nodes.size() >= _num_edges)
        return false;
#endif
      // add node
      nodes.push_back(to);
      // add node from "to" to "from"
      set_adj_node(to, from);
    }
    return true;
  }